

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O1

void __thiscall
slang::parsing::ParserBase::skipToken(ParserBase *this,optional<slang::DiagCode> diagCode)

{
  size_t *psVar1;
  Token *pTVar2;
  Info *pIVar3;
  long lVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  bool bVar8;
  TokenKind TVar9;
  Diagnostic *this_00;
  SourceRange range;
  TokenKind skipKind;
  SmallVector<slang::parsing::TokenKind,_20UL> delimStack;
  TokenKind local_92;
  Token local_90;
  SmallVectorBase<slang::parsing::TokenKind> local_80 [2];
  Token local_40;
  
  local_90 = peek(this);
  bVar8 = haveDiagAtCurrentLoc(this);
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
            (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,&local_90);
  uVar5 = (this->window).currentToken.field_0x2;
  NVar6.raw = (this->window).currentToken.numFlags.raw;
  uVar7 = (this->window).currentToken.rawLen;
  pIVar3 = (this->window).currentToken.info;
  (this->window).lastConsumed.kind = (this->window).currentToken.kind;
  (this->window).lastConsumed.field_0x2 = uVar5;
  (this->window).lastConsumed.numFlags = (NumericTokenFlags)NVar6.raw;
  (this->window).lastConsumed.rawLen = uVar7;
  (this->window).lastConsumed.info = pIVar3;
  Token::Token((Token *)local_80);
  *(pointer *)&(this->window).currentToken = local_80[0].data_;
  (this->window).currentToken.info = (Info *)local_80[0].len;
  psVar1 = &(this->window).currentOffset;
  *psVar1 = *psVar1 + 1;
  if (((uint6)diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
              super__Optional_payload_base<slang::DiagCode> & 0x100000000) != 0 && !bVar8) {
    range = Token::range(&local_90);
    this_00 = addDiag(this,diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::DiagCode>._M_payload._M_value,
                      range.startLoc);
    Diagnostic::operator<<(this_00,range);
  }
  local_92 = slang::syntax::SyntaxFacts::getSkipToKind(local_90.kind);
  if (local_92 != Unknown) {
    pTVar2 = &(this->window).currentToken;
    local_80[0].data_ = (pointer)local_80[0].firstElement;
    local_80[0].len = 0;
    local_80[0].cap = 0x14;
    while( true ) {
      local_90 = peek(this);
      if (local_90.kind == EndOfFile) break;
      bVar8 = slang::syntax::SyntaxFacts::isEndKeyword(local_90.kind);
      if (bVar8) {
        while (local_90.kind != local_92) {
          lVar4 = local_80[0].len - 1;
          if (lVar4 == -1) goto LAB_003da35e;
          local_80[0].len = lVar4;
          local_92 = *(TokenKind *)((long)local_80[0].data_ + lVar4 * 2);
        }
      }
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,&local_90);
      uVar5 = pTVar2->field_0x2;
      NVar6.raw = (pTVar2->numFlags).raw;
      uVar7 = pTVar2->rawLen;
      pIVar3 = (this->window).currentToken.info;
      (this->window).lastConsumed.kind = pTVar2->kind;
      (this->window).lastConsumed.field_0x2 = uVar5;
      (this->window).lastConsumed.numFlags = (NumericTokenFlags)NVar6.raw;
      (this->window).lastConsumed.rawLen = uVar7;
      (this->window).lastConsumed.info = pIVar3;
      Token::Token(&local_40);
      pTVar2->kind = local_40.kind;
      pTVar2->field_0x2 = local_40._2_1_;
      pTVar2->numFlags = (NumericTokenFlags)local_40.numFlags.raw;
      pTVar2->rawLen = local_40.rawLen;
      (this->window).currentToken.info = local_40.info;
      psVar1 = &(this->window).currentOffset;
      *psVar1 = *psVar1 + 1;
      if (local_90.kind == local_92) {
        if (local_80[0].len == 0) break;
        lVar4 = local_80[0].len - 1;
        local_80[0].len = local_80[0].len - 1;
        local_92 = *(TokenKind *)((long)local_80[0].data_ + lVar4 * 2);
      }
      else {
        TVar9 = slang::syntax::SyntaxFacts::getSkipToKind(local_90.kind);
        if (TVar9 != Unknown) {
          SmallVectorBase<slang::parsing::TokenKind>::emplace_back<slang::parsing::TokenKind_const&>
                    (local_80,&local_92);
          local_92 = TVar9;
        }
      }
    }
LAB_003da35e:
    if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
      operator_delete(local_80[0].data_);
    }
  }
  return;
}

Assistant:

void ParserBase::skipToken(std::optional<DiagCode> diagCode) {
    auto token = peek();
    SLANG_ASSERT(token.kind != TokenKind::EndOfFile);

    bool haveDiag = haveDiagAtCurrentLoc();
    skippedTokens.push_back(token);
    window.moveToNext();

    if (diagCode && !haveDiag)
        addDiag(*diagCode, token.range());

    // If the token we're skipping is an opening paren / bracket / brace,
    // skip everything up to the corresponding closing token, otherwise we're
    // pretty much guaranteed to report a bunch of spurious errors inside it.
    TokenKind skipKind = SF::getSkipToKind(token.kind);
    if (skipKind == TokenKind::Unknown)
        return;

    SmallVector<TokenKind> delimStack;
    while (true) {
        token = peek();
        if (token.kind == TokenKind::EndOfFile)
            return;

        // If this is an end keyword but not the one we're looking for,
        // it probably matches something higher in our stack so don't
        // necessarily consume it.
        if (SF::isEndKeyword(token.kind)) {
            while (token.kind != skipKind) {
                if (delimStack.empty())
                    return;

                skipKind = delimStack.back();
                delimStack.pop_back();
            }
        }

        skippedTokens.push_back(token);
        window.moveToNext();

        if (token.kind == skipKind) {
            if (delimStack.empty())
                return;

            skipKind = delimStack.back();
            delimStack.pop_back();
        }
        else {
            TokenKind newSkipKind = SF::getSkipToKind(token.kind);
            if (newSkipKind != TokenKind::Unknown) {
                delimStack.push_back(skipKind);
                skipKind = newSkipKind;
            }
        }
    }
}